

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

sx_file_info * sx_os_stat(sx_file_info *__return_storage_ptr__,char *filepath)

{
  code *pcVar1;
  int iVar2;
  sx_file_type sVar3;
  sx_file_info *psVar4;
  stat st;
  stat local_a0;
  
  if (filepath == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x17f
                      ,"filepath");
    pcVar1 = (code *)swi(3);
    psVar4 = (sx_file_info *)(*pcVar1)();
    return psVar4;
  }
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->last_modified = 0;
  iVar2 = stat(filepath,&local_a0);
  if (iVar2 == 0) {
    sVar3 = SX_FILE_TYPE_REGULAR;
    if (((short)local_a0.st_mode < 0) ||
       (sVar3 = SX_FILE_TYPE_DIRECTORY, (local_a0.st_mode >> 0xe & 1) != 0)) {
      __return_storage_ptr__->type = sVar3;
    }
    __return_storage_ptr__->size = local_a0.st_size;
    __return_storage_ptr__->last_modified = local_a0.st_mtim.tv_sec;
  }
  return __return_storage_ptr__;
}

Assistant:

sx_file_info sx_os_stat(const char* filepath)
{
    sx_assert(filepath);
    sx_file_info info = { SX_FILE_TYPE_INVALID, 0, 0 };

#if SX_PLATFORM_WINDOWS
    WIN32_FILE_ATTRIBUTE_DATA fad;
    if (!GetFileAttributesExA(filepath, GetFileExInfoStandard, &fad)) {
        return info;
    }
    if (fad.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
        info.type = SX_FILE_TYPE_DIRECTORY;
    else if (!(fad.dwFileAttributes & (FILE_ATTRIBUTE_DEVICE | FILE_ATTRIBUTE_SYSTEM)))
        info.type = SX_FILE_TYPE_REGULAR;

    LARGE_INTEGER size;
    size.HighPart = fad.nFileSizeHigh;
    size.LowPart = fad.nFileSizeLow;
    info.size = (uint64_t)size.QuadPart;

    LARGE_INTEGER tm;
    tm.HighPart = fad.ftLastWriteTime.dwHighDateTime;
    tm.LowPart = fad.ftLastWriteTime.dwLowDateTime;
    info.last_modified = (uint64_t)(tm.QuadPart / 10000000 - 11644473600LL);
#else // if SX_PLATFORM_WINDOWS
    struct stat st;
    int32_t result = stat(filepath, &st);
    if (0 != result)
        return info;

    if (0 != (st.st_mode & S_IFREG))
        info.type = SX_FILE_TYPE_REGULAR;
    else if (0 != (st.st_mode & S_IFDIR))
        info.type = SX_FILE_TYPE_DIRECTORY;
    info.size = st.st_size;
#    if SX_PLATFORM_OSX || SX_PLATFORM_IOS
    info.last_modified = st.st_mtimespec.tv_sec;
#    else
    info.last_modified = st.st_mtim.tv_sec;
#    endif
#endif    // else SX_PLATFORM_WINDOWS

    return info;
}